

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_3b19::test6<Iex_3_2::EchildExc>(void)

{
  bool bVar1;
  __type _Var2;
  ostream *this;
  code *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  allocator<char> *__a;
  EchildExc *this_01;
  EchildExc *e;
  bool caught;
  EchildExc e7;
  EchildExc e6;
  EchildExc e5;
  string str5;
  EchildExc e4;
  string str4;
  EchildExc e3;
  EchildExc e2;
  stringstream ss;
  EchildExc e1;
  EchildExc e0;
  char *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  EchildExc local_468 [72];
  EchildExc local_420 [72];
  EchildExc local_3d8 [79];
  undefined1 local_389 [33];
  EchildExc local_368 [79];
  undefined1 local_319 [33];
  string local_2f8 [32];
  EchildExc local_2d8 [72];
  string local_290 [32];
  EchildExc local_270 [72];
  stringstream local_228 [16];
  ostream local_218 [392];
  EchildExc local_90 [72];
  EchildExc local_48 [72];
  
  this = std::operator<<((ostream *)&std::cout,"6");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Iex_3_2::setStackTracer((anonymous_namespace)::getStackTrace_abi_cxx11_);
  pcVar3 = (code *)Iex_3_2::stackTracer_abi_cxx11_();
  if (pcVar3 != (anonymous_namespace)::getStackTrace_abi_cxx11_) {
    __assert_fail("IEX_INTERNAL_NAMESPACE::stackTracer () == getStackTrace",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xbd,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::EchildExc::EchildExc(local_48);
  Iex_3_2::EchildExc::EchildExc(local_90,"arg");
  Iex_3_2::BaseExc::operator+=((BaseExc *)local_90,"X");
  std::__cxx11::stringstream::stringstream(local_228);
  std::operator<<(local_218,"Y");
  Iex_3_2::BaseExc::operator+=((BaseExc *)local_90,local_228);
  Iex_3_2::EchildExc::EchildExc(local_270,local_90);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  if (!bVar1) {
    __assert_fail("e1.message () == \"argXY\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xcf,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Iex_3_2::BaseExc::stackTrace_abi_cxx11_();
  (anonymous_namespace)::getStackTrace_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if (!_Var2) {
    __assert_fail("e1.stackTrace () == getStackTrace ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xd0,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  std::__cxx11::string::~string(local_290);
  __s = (char *)Iex_3_2::BaseExc::message_abi_cxx11_();
  Iex_3_2::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if (!_Var2) {
    __assert_fail("e2.message () == e1.message ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xd2,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  __a = (allocator<char> *)Iex_3_2::BaseExc::stackTrace_abi_cxx11_();
  Iex_3_2::BaseExc::stackTrace_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if (!_Var2) {
    __assert_fail("e2.stackTrace () == e1.stackTrace ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xd3,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::BaseExc::assign((char *)local_270);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  if (!bVar1) {
    __assert_fail("e2.message () == \"Z\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xd6,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::BaseExc::assign((stringstream *)local_270);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  if (!bVar1) {
    __assert_fail("e2.message () == \"Y\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xd8,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::EchildExc::EchildExc(local_2d8,local_228);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  std::__cxx11::stringstream::str();
  _Var2 = std::operator==(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if (!_Var2) {
    __assert_fail("e3.message () == ss.str ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xdb,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  std::__cxx11::string::~string(local_2f8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_319;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::allocator<char>::~allocator((allocator<char> *)local_319);
  Iex_3_2::EchildExc::EchildExc(local_368,(string *)(local_319 + 1));
  Iex_3_2::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(__lhs,in_stack_fffffffffffffb58);
  if (!_Var2) {
    __assert_fail("e4.message() == str4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xdf,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::allocator<char>::~allocator((allocator<char> *)local_389);
  Iex_3_2::EchildExc::EchildExc(local_3d8,(string *)(local_389 + 1));
  Iex_3_2::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(__lhs,__rhs);
  if (!_Var2) {
    __assert_fail("e5.message() == str5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xe3,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::EchildExc::EchildExc(local_420,"e6");
  Iex_3_2::EchildExc::EchildExc(local_468,local_420);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  Iex_3_2::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(__lhs,__rhs);
  if (!_Var2) {
    __assert_fail("e7.message() == e6.message()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xe8,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  Iex_3_2::EchildExc::~EchildExc(local_468);
  Iex_3_2::EchildExc::~EchildExc(local_420);
  Iex_3_2::EchildExc::operator=(local_3d8,local_368);
  Iex_3_2::BaseExc::message_abi_cxx11_();
  Iex_3_2::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(__lhs,__rhs);
  if (!_Var2) {
    __assert_fail("e5.message() == e4.message()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                  ,0xed,"void (anonymous namespace)::test6() [T = Iex_3_2::EchildExc]");
  }
  this_01 = (EchildExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::EchildExc::EchildExc(this_01,local_90);
  __cxa_throw(this_01,&Iex_3_2::EchildExc::typeinfo,Iex_3_2::EchildExc::~EchildExc);
}

Assistant:

void
test6 ()
{
    std::cout << "6" << std::endl;

    IEX_INTERNAL_NAMESPACE::setStackTracer (getStackTrace);
    assert (IEX_INTERNAL_NAMESPACE::stackTracer () == getStackTrace);

    //
    // Test the constructors that take char* and stringstream,
    // and the += and assign functions.
    //

    T e0;
    
    T e1 ("arg");

    e1 += "X";
    std::stringstream ss;
    ss << "Y";
    e1 += ss;

    T e2 (e1); 

    assert (e1.message () == "argXY");
    assert (e1.stackTrace () == getStackTrace ());

    assert (e2.message () == e1.message ());
    assert (e2.stackTrace () == e1.stackTrace ());

    e2.assign ("Z");
    assert (e2.message () == "Z");
    e2.assign (ss);
    assert (e2.message () == "Y");

    T e3 (ss);
    assert (e3.message () == ss.str ());

    std::string str4 ("e4");
    T e4(str4);
    assert (e4.message() == str4);

    const std::string str5 ("e5");
    T e5(str5);
    assert (e5.message() == str5);
    
    {
        const T e6("e6");
        T e7(e6);
        assert (e7.message() == e6.message());
    }

    {
        e5 = e4;
        assert (e5.message() == e4.message());
    }
    
    //
    // Confirm the throw/catch
    //

    bool caught = false;

    try
    {
        throw e1;
    }
    catch (T& e)
    {
        caught = true;
        assert (e.message () == e1.message ());
    }
    catch (...)
    {
        assert (false);
    }

    assert (caught);
}